

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_set_snd_settle_mode(ATTACH_HANDLE attach,sender_settle_mode snd_settle_mode_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ATTACH_INSTANCE *attach_instance;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x10e9;
  }
  else {
    item_value = amqpvalue_create_ubyte(snd_settle_mode_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x10f1;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,3,item_value);
      iVar2 = 0x10f7;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_snd_settle_mode(ATTACH_HANDLE attach, sender_settle_mode snd_settle_mode_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE snd_settle_mode_amqp_value = amqpvalue_create_sender_settle_mode(snd_settle_mode_value);
        if (snd_settle_mode_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 3, snd_settle_mode_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(snd_settle_mode_amqp_value);
        }
    }

    return result;
}